

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

dir_tree_t * add_dirs(char **argv)

{
  short sVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  file_entry_t *pfVar5;
  dir_tree_t *unaff_R12;
  dir_tree_t *pdVar6;
  
  lVar2 = fts_open(argv,2,0);
  if (lVar2 == 0) {
    add_dirs_cold_1();
    pdVar6 = (dir_tree_t *)0x0;
  }
  else {
    lVar3 = fts_read(lVar2);
    if (lVar3 == 0) {
      pdVar6 = (dir_tree_t *)0x0;
    }
    else {
      pdVar6 = (dir_tree_t *)0x0;
      do {
        sVar1 = *(short *)(lVar3 + 0x62);
        if (sVar1 == 1) {
          if (*(char *)(lVar3 + 0x70) == '.') {
            fts_set(lVar2,lVar3,4);
            sVar1 = *(short *)(lVar3 + 0x62);
            if (sVar1 != 1) goto LAB_00103805;
          }
          if (*(short *)(lVar3 + 0x60) == 0) {
            unaff_R12 = alloc_dir_tree(*(char **)(lVar3 + 0x30));
            if (unaff_R12 != (dir_tree_t *)0x0) {
              unaff_R12->next = pdVar6;
              sVar1 = *(short *)(lVar3 + 0x62);
              pdVar6 = unaff_R12;
              goto LAB_00103805;
            }
LAB_0010385d:
            no_mem = 1;
            break;
          }
        }
        else {
LAB_00103805:
          if ((sVar1 == 8) &&
             (sVar4 = strlen((char *)(lVar3 + 0x70)), *(char *)(sVar4 + 0x6f + lVar3) != '~')) {
            pfVar5 = alloc_file_entry("",*(char **)(lVar3 + 0x30),
                                      *(time_t *)(*(long *)(lVar3 + 0x68) + 0x58));
            if (pfVar5 == (file_entry_t *)0x0) goto LAB_0010385d;
            pfVar5->next = unaff_R12->files;
            unaff_R12->files = pfVar5;
          }
        }
        lVar3 = fts_read(lVar2);
      } while (lVar3 != 0);
    }
    fts_close(lVar2);
  }
  return pdVar6;
}

Assistant:

dir_tree_t *add_dirs(char **argv)
{
	FTS *fts;
	FTSENT *ent;
	dir_tree_t *tree, *trees = NULL;
	file_entry_t *file;

	fts = fts_open(argv, FTS_LOGICAL, NULL);
	if (fts == NULL)
	{
		fprintf(stderr, "Failed to start directory traversal: %s\n", strerror(errno));
		return NULL;
	}
	while ((ent = fts_read(fts)) != NULL)
	{
		if (ent->fts_info == FTS_D && ent->fts_name[0] == '.')
		{
			// Skip hidden directories. (Prevents SVN bookkeeping
			// info from being included.)
			// [BL] Also skip backup files.
			fts_set(fts, ent, FTS_SKIP);
		}
		if (ent->fts_info == FTS_D && ent->fts_level == 0)
		{
			tree = alloc_dir_tree(ent->fts_path);
			if (tree == NULL)
			{
				no_mem = 1;
				break;
			}
			tree->next = trees;
			trees = tree;
		}
		if (ent->fts_info != FTS_F)
		{
			// We're only interested in remembering files.
			continue;
		}
		else if(ent->fts_name[strlen(ent->fts_name)-1] == '~')
		{
			// Don't remember backup files.
			continue;
		}
		file = alloc_file_entry("", ent->fts_path, ent->fts_statp->st_mtime);
		if (file == NULL)
		{
			no_mem = 1;
			break;
		}
		file->next = tree->files;
		tree->files = file;
	}
	fts_close(fts);
	return trees;
}